

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameUnmapSelectCb(Walker *pWalker,Select *p)

{
  Parse *pParse_00;
  ExprList *pEVar1;
  SrcList *pSVar2;
  SrcList *pSrc;
  ExprList *pList;
  int i;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  pParse_00 = pWalker->pParse;
  if (pParse_00->nErr == 0) {
    if ((p->selFlags & 0x4200000) == 0) {
      if (p->pEList != (ExprList *)0x0) {
        pEVar1 = p->pEList;
        for (pList._4_4_ = 0; pList._4_4_ < pEVar1->nExpr; pList._4_4_ = pList._4_4_ + 1) {
          if ((pEVar1->a[pList._4_4_].zEName != (char *)0x0) &&
             ((*(ushort *)&pEVar1->a[pList._4_4_].fg.field_0x1 & 3) == 0)) {
            sqlite3RenameTokenRemap(pParse_00,(void *)0x0,pEVar1->a[pList._4_4_].zEName);
          }
        }
      }
      if (p->pSrc != (SrcList *)0x0) {
        pSVar2 = p->pSrc;
        for (pList._4_4_ = 0; pList._4_4_ < pSVar2->nSrc; pList._4_4_ = pList._4_4_ + 1) {
          sqlite3RenameTokenRemap(pParse_00,(void *)0x0,pSVar2->a[pList._4_4_].zName);
          if ((*(ushort *)&pSVar2->a[pList._4_4_].fg.field_0x1 >> 10 & 1) == 0) {
            sqlite3WalkExpr(pWalker,pSVar2->a[pList._4_4_].u3.pOn);
          }
          else {
            unmapColumnIdlistNames(pParse_00,pSVar2->a[pList._4_4_].u3.pUsing);
          }
        }
      }
      renameWalkWith(pWalker,p);
      pWalker_local._4_4_ = 0;
    }
    else {
      pWalker_local._4_4_ = 1;
    }
  }
  else {
    pWalker_local._4_4_ = 2;
  }
  return pWalker_local._4_4_;
}

Assistant:

static int renameUnmapSelectCb(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i;
  if( pParse->nErr ) return WRC_Abort;
  testcase( p->selFlags & SF_View );
  testcase( p->selFlags & SF_CopyCte );
  if( p->selFlags & (SF_View|SF_CopyCte) ){
    return WRC_Prune;
  }
  if( ALWAYS(p->pEList) ){
    ExprList *pList = p->pEList;
    for(i=0; i<pList->nExpr; i++){
      if( pList->a[i].zEName && pList->a[i].fg.eEName==ENAME_NAME ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pList->a[i].zEName);
      }
    }
  }
  if( ALWAYS(p->pSrc) ){  /* Every Select as a SrcList, even if it is empty */
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      sqlite3RenameTokenRemap(pParse, 0, (void*)pSrc->a[i].zName);
      if( pSrc->a[i].fg.isUsing==0 ){
        sqlite3WalkExpr(pWalker, pSrc->a[i].u3.pOn);
      }else{
        unmapColumnIdlistNames(pParse, pSrc->a[i].u3.pUsing);
      }
    }
  }

  renameWalkWith(pWalker, p);
  return WRC_Continue;
}